

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_setBuffer(PHYSFS_File *handle,PHYSFS_uint64 _bufsize)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  PHYSFS_uint8 *newbuf;
  PHYSFS_sint64 curpos;
  PHYSFS_uint64 pos;
  size_t bufsize;
  FileHandle *fh;
  PHYSFS_uint64 _bufsize_local;
  PHYSFS_File *handle_local;
  
  iVar1 = PHYSFS_flush(handle);
  if (iVar1 == 0) {
    return 0;
  }
  if ((*(char *)&handle[1].opaque != '\0') && (handle[5].opaque != handle[6].opaque)) {
    lVar2 = (**(code **)((long)handle->opaque + 0x28))(handle->opaque);
    if (lVar2 == -1) {
      return 0;
    }
    iVar1 = (**(code **)((long)handle->opaque + 0x20))
                      (handle->opaque,(lVar2 - (long)handle[5].opaque) + (long)handle[6].opaque);
    if (iVar1 == 0) {
      return 0;
    }
  }
  if (_bufsize == 0) {
    if (handle[3].opaque != (void *)0x0) {
      (*__PHYSFS_AllocatorHooks.Free)(handle[3].opaque);
      handle[3].opaque = (void *)0x0;
    }
  }
  else {
    pvVar3 = (*__PHYSFS_AllocatorHooks.Realloc)(handle[3].opaque,_bufsize);
    if (pvVar3 == (void *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      return 0;
    }
    handle[3].opaque = pvVar3;
  }
  handle[4].opaque = (void *)_bufsize;
  handle[6].opaque = (void *)0x0;
  handle[5].opaque = (void *)0x0;
  return 1;
}

Assistant:

int PHYSFS_setBuffer(PHYSFS_File *handle, PHYSFS_uint64 _bufsize)
{
    FileHandle *fh = (FileHandle *) handle;
    const size_t bufsize = (size_t) _bufsize;

    if (!__PHYSFS_ui64FitsAddressSpace(_bufsize))
        BAIL(PHYSFS_ERR_INVALID_ARGUMENT, 0);

    BAIL_IF_ERRPASS(!PHYSFS_flush(handle), 0);

    /*
     * For reads, we need to move the file pointer to where it would be
     *  if we weren't buffering, so that the next read will get the
     *  right chunk of stuff from the file. PHYSFS_flush() handles writes.
     */
    if ((fh->forReading) && (fh->buffill != fh->bufpos))
    {
        PHYSFS_uint64 pos;
        const PHYSFS_sint64 curpos = fh->io->tell(fh->io);
        BAIL_IF_ERRPASS(curpos == -1, 0);
        pos = ((curpos - fh->buffill) + fh->bufpos);
        BAIL_IF_ERRPASS(!fh->io->seek(fh->io, pos), 0);
    } /* if */

    if (bufsize == 0)  /* delete existing buffer. */
    {
        if (fh->buffer)
        {
            allocator.Free(fh->buffer);
            fh->buffer = NULL;
        } /* if */
    } /* if */

    else
    {
        PHYSFS_uint8 *newbuf;
        newbuf = (PHYSFS_uint8 *) allocator.Realloc(fh->buffer, bufsize);
        BAIL_IF(!newbuf, PHYSFS_ERR_OUT_OF_MEMORY, 0);
        fh->buffer = newbuf;
    } /* else */

    fh->bufsize = bufsize;
    fh->buffill = fh->bufpos = 0;
    return 1;
}